

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::EmitterBeam::ClearTrackedJammedTargets(EmitterBeam *this)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  
  pTVar1 = (this->m_vTrackJamTargets).
           super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->m_vTrackJamTargets).
           super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar3 = pTVar1;
  if (pTVar2 != pTVar1) {
    do {
      (**(pTVar3->super_EntityIdentifier).super_SimulationIdentifier.super_DataTypeBase.
         _vptr_DataTypeBase)(pTVar3);
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != pTVar2);
    (this->m_vTrackJamTargets).
    super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar1;
  }
  this->m_ui8NumTargetInTrackJamField = '\0';
  this->m_ui8BeamDataLength = '\r';
  return;
}

Assistant:

void EmitterBeam::ClearTrackedJammedTargets()
{
    m_vTrackJamTargets.clear();
    m_ui8NumTargetInTrackJamField = 0;
    m_ui8BeamDataLength = EMITTER_BEAM_SIZE / 4; 
}